

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

Array * __thiscall
spvtools::opt::InstrumentPass::GetArray(InstrumentPass *this,Type *element,uint32_t length)

{
  int iVar1;
  ConstantManager *this_00;
  TypeManager *this_01;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LengthInfo length_info;
  Array r;
  undefined1 local_98 [8];
  pointer local_90;
  pointer puStack_88;
  pointer local_80;
  Array local_78;
  
  this_00 = IRContext::get_constant_mgr((this->super_Pass).context_);
  local_98._0_4_ = analysis::ConstantManager::GetUIntConstId(this_00,length);
  local_78.super_Type._vptr_Type._0_4_ = 0;
  local_90 = (pointer)0x0;
  puStack_88 = (pointer)0x0;
  local_80 = (pointer)0x0;
  local_78.super_Type._vptr_Type._4_4_ = length;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_90,&local_78);
  analysis::Array::Array(&local_78,element,(LengthInfo *)local_98);
  this_01 = IRContext::get_type_mgr((this->super_Pass).context_);
  pTVar2 = analysis::TypeManager::GetRegisteredType(this_01,&local_78.super_Type);
  if (pTVar2 != (Type *)0x0) {
    iVar1 = (*pTVar2->_vptr_Type[0x17])(pTVar2);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*pTVar2->_vptr_Type[0x17])(pTVar2);
      analysis::Array::~Array(&local_78);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
      return (Array *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  __assert_fail("type && type->AsArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                ,0x19f,
                "analysis::Array *spvtools::opt::InstrumentPass::GetArray(const analysis::Type *, uint32_t)"
               );
}

Assistant:

analysis::Array* InstrumentPass::GetArray(const analysis::Type* element,
                                          uint32_t length) {
  uint32_t length_id = context()->get_constant_mgr()->GetUIntConstId(length);
  analysis::Array::LengthInfo length_info{
      length_id, {analysis::Array::LengthInfo::Case::kConstant, length}};

  analysis::Array r(element, length_info);

  analysis::Type* type = context()->get_type_mgr()->GetRegisteredType(&r);
  assert(type && type->AsArray());
  return type->AsArray();
}